

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O2

void test_open_address_hashmap_simple_insert_and_query(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_status_t iVar3;
  char *expected;
  int iVar4;
  uint local_78;
  char str [10];
  ion_hashmap_t map;
  
  initialize_hash_map_std_conditions(&map);
  local_78 = 0;
  while( true ) {
    iVar4 = map.map_size;
    if (map.map_size <= (int)local_78) break;
    sprintf(str,"%02i is key");
    iVar3 = oah_insert(&map,&local_78,str);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar3.error == '\0'),0x14c,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00101c57;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x14d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00101c57;
    local_78 = local_78 + 1;
  }
  expected = (char *)malloc(10);
  for (local_78 = 0; (int)local_78 < iVar4; local_78 = local_78 + 1) {
    iVar3 = oah_get(&map,&local_78,expected);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar3.error == '\0'),0x156,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00101c57;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x157,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00101c57;
    sprintf(str,"%02i is key",(ulong)local_78);
    pVar1 = planck_unit_assert_str_are_equal
                      (tc,expected,str,0x15d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                      );
    if (pVar1 == '\0') goto LAB_00101c57;
    iVar4 = map.map_size;
  }
  free(expected);
  iVar2 = oah_destroy(&map);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2 == '\0'),0x165,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    return;
  }
LAB_00101c57:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_insert_and_query(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	for (i = 0; i < map.map_size; i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		/* this is will wrap the map */
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	ion_value_t value;

	value = malloc(10);

	for (i = 0; i < map.map_size; i++) {
		status = oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);
	}

	/* must free value after query */
	if (value != NULL) {
		free(value);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}